

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O3

string * __thiscall
Diligent::Parsing::
RefinePreprocessorDirective<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (string *__return_storage_ptr__,Parsing *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Start,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *End)

{
  char *pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  DirectiveStart;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  pcVar1 = *(char **)this;
  if ((pcVar1 == Start->_M_current) || (*pcVar1 != '#')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_28._M_current = pcVar1 + 1;
    local_20 = SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         (&local_28,Start," \t",SKIP_COMMENT_FLAG_MULTILINE);
    _Var2 = SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (&local_20,Start);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)__return_storage_ptr__,local_20._M_current,_Var2._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RefinePreprocessorDirective(const InteratorType& Start, const InteratorType& End) noexcept
{
    // # /* Comment */ define
    // ^
    // Pos
    if (Start == End || *Start != '#')
        return "";

    const auto DirectiveStart = SkipDelimitersAndComments(Start + 1, End, " \t", SKIP_COMMENT_FLAG_MULTILINE);
    // # /* Comment */ define
    //                 ^
    //          DirectiveStart

    const auto DirectiveEnd = SkipIdentifier(DirectiveStart, End);
    // # /* Comment */ define
    //                       ^
    //                      Pos

    return std::string{DirectiveStart, DirectiveEnd};
}